

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setMask(QWidget *this,QRegion *newMask)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  pointer pQVar4;
  ulong uVar5;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  QRegion parentExpose;
  QRegion expose;
  QRegion oldMask;
  QRect *in_stack_ffffffffffffff68;
  QWidgetPrivate *in_stack_ffffffffffffff70;
  QWidget *this_00;
  undefined4 in_stack_ffffffffffffff78;
  QWidget *this_01;
  QRegion local_50;
  QPoint local_48;
  QRect local_40;
  QRegion local_30;
  QRect local_28;
  QRegion local_18;
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x3826a5);
  QWidgetPrivate::createExtra(in_stack_ffffffffffffff70);
  this_01 = in_RSI;
  pQVar4 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3826cc);
  uVar5 = QRegion::operator==((QRegion *)this_01,(QRegion *)&pQVar4->mask);
  if ((uVar5 & 1) == 0) {
    local_10.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x382705);
    QRegion::QRegion(&local_10,(QRegion *)&pQVar4->mask);
    this_00 = in_RSI;
    pQVar4 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x382731);
    QRegion::operator=(&pQVar4->mask,(QRegion *)this_00);
    bVar1 = QRegion::isEmpty();
    uVar3 = (uint)((bVar1 ^ 0xff) & 1);
    pQVar4 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x382765);
    *(ushort *)&pQVar4->field_0x7c =
         *(ushort *)&pQVar4->field_0x7c & 0xff7f | ((ushort)uVar3 & 1) << 7;
    bVar2 = testAttribute((QWidget *)CONCAT44(uVar3,in_stack_ffffffffffffff78),
                          (WidgetAttribute)((ulong)this_00 >> 0x20));
    if (bVar2) {
      QWidgetPrivate::setMask_sys(in_RDI,(QRegion *)CONCAT44(uVar3,in_stack_ffffffffffffff78));
      bVar2 = isVisible((QWidget *)0x3827bd);
      if (bVar2) {
        pQVar4 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x3827dc);
        if ((*(ushort *)&pQVar4->field_0x7c >> 7 & 1) == 0) {
          local_18.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          local_28 = rect(this_01);
          QRegion::QRegion(&local_18,(QRect *)&local_28,Rectangle);
          QRegion::operator-=(&local_18,(QRegion *)&local_10);
          uVar5 = QRegion::isEmpty();
          if ((uVar5 & 1) == 0) {
            QWidgetPrivate::setDirtyOpaqueRegion(in_RDI);
            update((QWidget *)in_RDI,(QRegion *)CONCAT44(uVar3,in_stack_ffffffffffffff78));
          }
          QRegion::~QRegion(&local_18);
        }
        else {
          bVar2 = isWindow(this_00);
          if (!bVar2) {
            local_30.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            local_40 = rect(this_01);
            QRegion::QRegion(&local_30,(QRect *)&local_40,Rectangle);
            QRegion::operator-=(&local_30,(QRegion *)in_RSI);
            uVar5 = QRegion::isEmpty();
            if ((uVar5 & 1) == 0) {
              QWidgetPrivate::setDirtyOpaqueRegion(in_RDI);
              local_48 = QRect::topLeft(in_stack_ffffffffffffff68);
              QRegion::translate((QRegion *)in_RDI,
                                 (QPoint *)CONCAT44(uVar3,in_stack_ffffffffffffff78));
              parentWidget((QWidget *)0x382921);
              update((QWidget *)in_RDI,(QRegion *)CONCAT44(uVar3,in_stack_ffffffffffffff78));
            }
            uVar5 = QRegion::isEmpty();
            if ((uVar5 & 1) == 0) {
              QRegion::operator-(&local_50,(QRegion *)in_RSI);
              update((QWidget *)in_RDI,(QRegion *)CONCAT44(uVar3,in_stack_ffffffffffffff78));
              QRegion::~QRegion(&local_50);
            }
            QRegion::~QRegion(&local_30);
          }
        }
      }
    }
    QRegion::~QRegion(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setMask(const QRegion &newMask)
{
    Q_D(QWidget);

    d->createExtra();
    if (newMask == d->extra->mask)
        return;

#ifndef QT_NO_BACKINGSTORE
    const QRegion oldMask(d->extra->mask);
#endif

    d->extra->mask = newMask;
    d->extra->hasMask = !newMask.isEmpty();

    if (!testAttribute(Qt::WA_WState_Created))
        return;

    d->setMask_sys(newMask);

#ifndef QT_NO_BACKINGSTORE
    if (!isVisible())
        return;

    if (!d->extra->hasMask) {
        // Mask was cleared; update newly exposed area.
        QRegion expose(rect());
        expose -= oldMask;
        if (!expose.isEmpty()) {
            d->setDirtyOpaqueRegion();
            update(expose);
        }
        return;
    }

    if (!isWindow()) {
        // Update newly exposed area on the parent widget.
        QRegion parentExpose(rect());
        parentExpose -= newMask;
        if (!parentExpose.isEmpty()) {
            d->setDirtyOpaqueRegion();
            parentExpose.translate(data->crect.topLeft());
            parentWidget()->update(parentExpose);
        }

        // Update newly exposed area on this widget
        if (!oldMask.isEmpty())
            update(newMask - oldMask);
    }
#endif
}